

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.cpp
# Opt level: O1

void gotostat(LexState *ls,int pc)

{
  int iVar1;
  int iVar2;
  TString *name;
  
  iVar2 = ls->linenumber;
  iVar1 = (ls->t).token;
  luaX_next(ls);
  if (iVar1 == 0x10a) {
    name = str_checkname(ls);
  }
  else {
    name = luaS_new(ls->L,"break");
  }
  iVar2 = newlabelentry(ls,&ls->dyd->gt,name,iVar2,pc);
  findlabel(ls,iVar2);
  return;
}

Assistant:

static void gotostat (LexState *ls, int pc) {
  int line = ls->linenumber;
  TString *label;
  int g;
  if (testnext(ls, TK_GOTO))
    label = str_checkname(ls);
  else {
    luaX_next(ls);  /* skip break */
    label = luaS_new(ls->L, "break");
  }
  g = newlabelentry(ls, &ls->dyd->gt, label, line, pc);
  findlabel(ls, g);  /* close it if label already defined */
}